

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHash.h
# Opt level: O0

int Hash_Int2ManInsert(Hash_IntMan_t *p,int iData0,int iData1,int iData2)

{
  Vec_Int_t *p_00;
  int iVar1;
  Hash_IntObj_t *pHVar2;
  int *piVar3;
  int *pPlace;
  int nObjs;
  int i;
  Hash_IntObj_t *pObj;
  int iData2_local;
  int iData1_local;
  int iData0_local;
  Hash_IntMan_t *p_local;
  
  iVar1 = Vec_IntSize(p->vObjs);
  p_local._4_4_ = iVar1 / 4;
  iVar1 = Vec_IntSize(p->vTable);
  if (iVar1 < p_local._4_4_) {
    p_00 = p->vTable;
    iVar1 = Vec_IntSize(p->vTable);
    iVar1 = Abc_PrimeCudd(iVar1 << 1);
    Vec_IntFill(p_00,iVar1,0);
    for (pPlace._4_4_ = 1; pPlace._4_4_ < p_local._4_4_; pPlace._4_4_ = pPlace._4_4_ + 1) {
      pHVar2 = Hash_IntObj(p,pPlace._4_4_);
      pHVar2->iNext = 0;
      piVar3 = Hash_Int2ManLookup(p,pHVar2->iData0,pHVar2->iData1);
      if (*piVar3 != 0) {
        __assert_fail("*pPlace == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecHash.h"
                      ,0xac,"int Hash_Int2ManInsert(Hash_IntMan_t *, int, int, int)");
      }
      *piVar3 = pPlace._4_4_;
    }
  }
  piVar3 = Hash_Int2ManLookup(p,iData0,iData1);
  if (*piVar3 == 0) {
    *piVar3 = p_local._4_4_;
    Vec_IntPush(p->vObjs,iData0);
    Vec_IntPush(p->vObjs,iData1);
    Vec_IntPush(p->vObjs,iData2);
    Vec_IntPush(p->vObjs,0);
  }
  else {
    p_local._4_4_ = *piVar3;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Hash_Int2ManInsert( Hash_IntMan_t * p, int iData0, int iData1, int iData2 )
{
    Hash_IntObj_t * pObj;
    int i, nObjs, * pPlace;
    nObjs = Vec_IntSize(p->vObjs)/4;
    if ( nObjs > Vec_IntSize(p->vTable) )
    {
//        printf( "Resizing...\n" );
        Vec_IntFill( p->vTable, Abc_PrimeCudd(2*Vec_IntSize(p->vTable)), 0 );
        for ( i = 1; i < nObjs; i++ )
        {
            pObj = Hash_IntObj( p, i );
            pObj->iNext = 0;
            pPlace = Hash_Int2ManLookup( p, pObj->iData0, pObj->iData1 );
            assert( *pPlace == 0 );
            *pPlace = i;
        }
    }
    pPlace = Hash_Int2ManLookup( p, iData0, iData1 );
    if ( *pPlace )
        return *pPlace;
    *pPlace = nObjs;
    Vec_IntPush( p->vObjs, iData0 );
    Vec_IntPush( p->vObjs, iData1 );
    Vec_IntPush( p->vObjs, iData2 );
    Vec_IntPush( p->vObjs, 0 );
    return nObjs;
}